

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode Guid_encodeBinary(UA_Guid *src,UA_DataType *_)

{
  UA_StatusCode UVar1;
  UA_StatusCode UVar2;
  UA_StatusCode UVar3;
  UA_StatusCode retval;
  UA_DataType *__local;
  UA_Guid *src_local;
  
  UVar1 = UInt32_encodeBinary(&src->data1,(UA_DataType *)0x0);
  UVar2 = UInt16_encodeBinary(&src->data2,(UA_DataType *)0x0);
  UVar3 = UInt16_encodeBinary(&src->data3,(UA_DataType *)0x0);
  src_local._4_4_ = UVar3 | UVar2 | UVar1;
  if (end < pos + 8) {
    src_local._4_4_ = 0x80080000;
  }
  else {
    *(undefined8 *)pos = *(undefined8 *)src->data4;
    pos = pos + 8;
  }
  return src_local._4_4_;
}

Assistant:

static UA_StatusCode
Guid_encodeBinary(UA_Guid const *src, const UA_DataType *_) {
    UA_StatusCode retval = UInt32_encodeBinary(&src->data1, NULL);
    retval |= UInt16_encodeBinary(&src->data2, NULL);
    retval |= UInt16_encodeBinary(&src->data3, NULL);
    if(pos + (8*sizeof(UA_Byte)) > end)
        return UA_STATUSCODE_BADENCODINGLIMITSEXCEEDED;
    memcpy(pos, src->data4, 8*sizeof(UA_Byte));
    pos += 8;
    return retval;
}